

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::Clear(ImDrawList *this)

{
  ImDrawCmd *__src;
  uint *__src_00;
  ImDrawVert *__src_01;
  ImVec4 *__src_02;
  void **__src_03;
  ImVec2 *__src_04;
  ImDrawListFlags IVar1;
  ImDrawCmd *__dest;
  uint *__dest_00;
  ImDrawVert *__dest_01;
  ImVec4 *__dest_02;
  void **__dest_03;
  ImVec2 *__dest_04;
  
  if ((this->CmdBuffer).Capacity < 0) {
    __dest = (ImDrawCmd *)ImGui::MemAlloc(0);
    __src = (this->CmdBuffer).Data;
    if (__src != (ImDrawCmd *)0x0) {
      memcpy(__dest,__src,(long)(this->CmdBuffer).Size * 0x38);
      ImGui::MemFree((this->CmdBuffer).Data);
    }
    (this->CmdBuffer).Data = __dest;
    (this->CmdBuffer).Capacity = 0;
  }
  (this->CmdBuffer).Size = 0;
  if ((this->IdxBuffer).Capacity < 0) {
    __dest_00 = (uint *)ImGui::MemAlloc(0);
    __src_00 = (this->IdxBuffer).Data;
    if (__src_00 != (uint *)0x0) {
      memcpy(__dest_00,__src_00,(long)(this->IdxBuffer).Size << 2);
      ImGui::MemFree((this->IdxBuffer).Data);
    }
    (this->IdxBuffer).Data = __dest_00;
    (this->IdxBuffer).Capacity = 0;
  }
  (this->IdxBuffer).Size = 0;
  if ((this->VtxBuffer).Capacity < 0) {
    __dest_01 = (ImDrawVert *)ImGui::MemAlloc(0);
    __src_01 = (this->VtxBuffer).Data;
    if (__src_01 != (ImDrawVert *)0x0) {
      memcpy(__dest_01,__src_01,(long)(this->VtxBuffer).Size * 0x14);
      ImGui::MemFree((this->VtxBuffer).Data);
    }
    (this->VtxBuffer).Data = __dest_01;
    (this->VtxBuffer).Capacity = 0;
  }
  (this->VtxBuffer).Size = 0;
  if (this->_Data == (ImDrawListSharedData *)0x0) {
    IVar1 = 0;
  }
  else {
    IVar1 = this->_Data->InitialFlags;
  }
  this->Flags = IVar1;
  this->_VtxCurrentOffset = 0;
  this->_VtxCurrentIdx = 0;
  this->_VtxWritePtr = (ImDrawVert *)0x0;
  this->_IdxWritePtr = (uint *)0x0;
  if ((this->_ClipRectStack).Capacity < 0) {
    __dest_02 = (ImVec4 *)ImGui::MemAlloc(0);
    __src_02 = (this->_ClipRectStack).Data;
    if (__src_02 != (ImVec4 *)0x0) {
      memcpy(__dest_02,__src_02,(long)(this->_ClipRectStack).Size << 4);
      ImGui::MemFree((this->_ClipRectStack).Data);
    }
    (this->_ClipRectStack).Data = __dest_02;
    (this->_ClipRectStack).Capacity = 0;
  }
  (this->_ClipRectStack).Size = 0;
  if ((this->_TextureIdStack).Capacity < 0) {
    __dest_03 = (void **)ImGui::MemAlloc(0);
    __src_03 = (this->_TextureIdStack).Data;
    if (__src_03 != (void **)0x0) {
      memcpy(__dest_03,__src_03,(long)(this->_TextureIdStack).Size << 3);
      ImGui::MemFree((this->_TextureIdStack).Data);
    }
    (this->_TextureIdStack).Data = __dest_03;
    (this->_TextureIdStack).Capacity = 0;
  }
  (this->_TextureIdStack).Size = 0;
  if ((this->_Path).Capacity < 0) {
    __dest_04 = (ImVec2 *)ImGui::MemAlloc(0);
    __src_04 = (this->_Path).Data;
    if (__src_04 != (ImVec2 *)0x0) {
      memcpy(__dest_04,__src_04,(long)(this->_Path).Size << 3);
      ImGui::MemFree((this->_Path).Data);
    }
    (this->_Path).Data = __dest_04;
    (this->_Path).Capacity = 0;
  }
  (this->_Path).Size = 0;
  (this->_Splitter)._Current = 0;
  (this->_Splitter)._Count = 1;
  return;
}

Assistant:

void ImDrawList::Clear()
{
    CmdBuffer.resize(0);
    IdxBuffer.resize(0);
    VtxBuffer.resize(0);
    Flags = _Data ? _Data->InitialFlags : ImDrawListFlags_None;
    _VtxCurrentOffset = 0;
    _VtxCurrentIdx = 0;
    _VtxWritePtr = NULL;
    _IdxWritePtr = NULL;
    _ClipRectStack.resize(0);
    _TextureIdStack.resize(0);
    _Path.resize(0);
    _Splitter.Clear();
}